

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_closed_fd_events(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  uv_buf_t *buf;
  undefined1 *nread;
  uv_stream_t *tcp;
  int64_t eval_b_1;
  int64_t eval_b_4;
  uv_os_fd_t fd [2];
  uv_fs_t req;
  uv_pipe_t pipe_handle;
  uv_stdio_container_t stdio [3];
  undefined1 local_320 [48];
  uv_handle_t *local_2f0 [11];
  uv_loop_t *local_298;
  undefined8 local_130 [29];
  uv_stdio_container_t local_48;
  undefined4 local_38;
  undefined4 local_28;
  
  local_320._24_16_ = uv_buf_init("",1);
  iVar1 = uv_pipe(local_320 + 0x10,0,0);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &local_48;
    local_48.flags = UV_INHERIT_FD;
    local_48.data.file = local_320._16_4_;
    local_38 = 0;
    local_28 = 0;
    uVar2 = uv_default_loop();
    iVar1 = uv_spawn(uVar2,&process,&options);
    local_2f0[0] = (uv_handle_t *)(long)iVar1;
    local_130[0] = 0;
    if (local_2f0[0] != (uv_handle_t *)0x0) goto LAB_001c33eb;
    uv_unref(&process);
    uVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar2,local_130,0);
    local_2f0[0] = (uv_handle_t *)(long)iVar1;
    local_320._0_8_ = (uv_loop_t *)0x0;
    if (local_2f0[0] != (uv_handle_t *)0x0) goto LAB_001c33fd;
    iVar1 = uv_pipe_open(local_130,local_320._16_4_);
    local_2f0[0] = (uv_handle_t *)(long)iVar1;
    local_320._0_8_ = (uv_loop_t *)0x0;
    if (local_2f0[0] != (uv_handle_t *)0x0) goto LAB_001c340c;
    local_320._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar1 = uv_read_start(local_130,on_alloc,on_read_once);
    local_2f0[0] = (uv_handle_t *)(long)iVar1;
    local_320._0_8_ = (uv_loop_t *)0x0;
    if (local_2f0[0] != (uv_handle_t *)0x0) goto LAB_001c341b;
    local_320._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,local_2f0,local_320._20_4_,local_320 + 0x18,1,0xffffffffffffffff,0);
    local_320._8_8_ = SEXT48(iVar1);
    if (local_320._0_8_ != local_320._8_8_) goto LAB_001c342a;
    local_320._0_8_ = (uv_loop_t *)0x1;
    local_320._8_8_ = local_298;
    if (local_298 != (uv_loop_t *)0x1) goto LAB_001c3439;
    uv_fs_req_cleanup(local_2f0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    local_320._0_8_ = SEXT48(iVar1);
    local_320._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3448;
    local_320._0_8_ = (uv_loop_t *)0x1;
    local_320._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)local_320._8_8_ != (uv_loop_t *)0x1) goto LAB_001c3457;
    uv_close(local_130,close_cb);
    local_320._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,local_2f0,local_320._20_4_,local_320 + 0x18,1,0xffffffffffffffff,0);
    local_320._8_8_ = SEXT48(iVar1);
    if (local_320._0_8_ != local_320._8_8_) goto LAB_001c3466;
    local_320._0_8_ = (uv_loop_t *)0x1;
    local_320._8_8_ = local_298;
    if (local_298 != (uv_loop_t *)0x1) goto LAB_001c3475;
    uv_fs_req_cleanup(local_2f0);
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,&timer);
    local_320._0_8_ = SEXT48(iVar1);
    local_320._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3484;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    local_320._0_8_ = SEXT48(iVar1);
    local_320._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3493;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 1) {
      uVar2 = uv_default_loop();
      iVar1 = uv_run(uVar2,1);
      local_320._0_8_ = SEXT48(iVar1);
      local_320._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34de;
    }
    local_320._0_8_ = (uv_loop_t *)0x1;
    local_320._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)local_320._8_8_ != (uv_loop_t *)0x1) goto LAB_001c34a2;
    iVar1 = uv_process_kill(&process,0xf);
    local_320._0_8_ = SEXT48(iVar1);
    local_320._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34b1;
    iVar1 = close(local_320._20_4_);
    local_320._0_8_ = SEXT48(iVar1);
    local_320._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34c0;
    local_320._20_4_ = -1;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    local_320._0_8_ = (uv_loop_t *)0x0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    local_320._8_8_ = SEXT48(iVar1);
    if (local_320._0_8_ == local_320._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001c33eb:
    run_test_closed_fd_events_cold_2();
LAB_001c33fd:
    run_test_closed_fd_events_cold_3();
LAB_001c340c:
    run_test_closed_fd_events_cold_4();
LAB_001c341b:
    run_test_closed_fd_events_cold_5();
LAB_001c342a:
    run_test_closed_fd_events_cold_6();
LAB_001c3439:
    run_test_closed_fd_events_cold_7();
LAB_001c3448:
    run_test_closed_fd_events_cold_8();
LAB_001c3457:
    run_test_closed_fd_events_cold_9();
LAB_001c3466:
    run_test_closed_fd_events_cold_10();
LAB_001c3475:
    run_test_closed_fd_events_cold_11();
LAB_001c3484:
    run_test_closed_fd_events_cold_12();
LAB_001c3493:
    run_test_closed_fd_events_cold_13();
LAB_001c34a2:
    run_test_closed_fd_events_cold_15();
LAB_001c34b1:
    run_test_closed_fd_events_cold_16();
LAB_001c34c0:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001c34de:
  tcp = (uv_stream_t *)local_320;
  nread = local_320 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop();
  on_read(tcp,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(closed_fd_events) {
  uv_stdio_container_t stdio[3];
  uv_pipe_t pipe_handle;
  uv_fs_t req;
  uv_buf_t bufs[1];
  uv_os_fd_t fd[2];
  bufs[0] = uv_buf_init("", 1);

  /* create a pipe and share it with a child process */
  ASSERT(0 == uv_pipe(fd, 0, 0));

  /* spawn_helper4 blocks indefinitely. */
  init_process_options("spawn_helper4", exit_cb);
  options.stdio_count = 3;
  options.stdio = stdio;
  options.stdio[0].flags = UV_INHERIT_FD;
  options.stdio[0].data.file = fd[0];
  options.stdio[1].flags = UV_IGNORE;
  options.stdio[2].flags = UV_IGNORE;

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));
  uv_unref((uv_handle_t*) &process);

  /* read from the pipe with uv */
  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT_OK(uv_pipe_open(&pipe_handle, fd[0]));
  /* uv_pipe_open() takes ownership of the file descriptor. */
#ifdef _WIN32
  fd[0] = INVALID_HANDLE_VALUE;
#else
  fd[0] = -1;
#endif

  ASSERT_OK(uv_read_start((uv_stream_t*) &pipe_handle,
                          on_alloc,
                          on_read_once));

  ASSERT_EQ(1, uv_fs_write(NULL, &req, fd[1], bufs, 1, -1, NULL));
  ASSERT_EQ(1, req.result);
  uv_fs_req_cleanup(&req);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_ONCE));

  /* should have received just one byte */
  ASSERT_EQ(1, output_used);

  /* close the pipe and see if we still get events */
  uv_close((uv_handle_t*) &pipe_handle, close_cb);

  ASSERT_EQ(1, uv_fs_write(NULL, &req, fd[1], bufs, 1, -1, NULL));
  ASSERT_EQ(1, req.result);
  uv_fs_req_cleanup(&req);

  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_counter_cb, 10, 0));

  /* see if any spurious events interrupt the timer */
  if (1 == uv_run(uv_default_loop(), UV_RUN_ONCE))
    /* have to run again to really trigger the timer */
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_ONCE));

  ASSERT_EQ(1, timer_counter);

  /* cleanup */
  ASSERT_OK(uv_process_kill(&process, SIGTERM));
#ifdef _WIN32
  ASSERT_NE(0, CloseHandle(fd[1]));
  fd[1] = INVALID_HANDLE_VALUE;
#else
  ASSERT_OK(close(fd[1]));
  fd[1] = -1;
#endif

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}